

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
google::protobuf::io::CodedInputStream::ReadVarint64Fallback(CodedInputStream *this)

{
  byte *pbVar1;
  bool bVar2;
  LogMessage *other;
  undefined7 extraout_var;
  size_t offset;
  long lVar3;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined7 uVar7;
  byte *pbVar4;
  long lVar5;
  ulong uVar6;
  long lVar8;
  pair<unsigned_long,_bool> pVar9;
  uint64_t temp;
  LogFinisher local_59;
  LogMessage local_58;
  
  pbVar1 = this->buffer_;
  pbVar4 = this->buffer_end_;
  if (((int)pbVar4 - (int)pbVar1 < 10) && ((pbVar4 <= pbVar1 || ((char)pbVar4[-1] < '\0')))) {
    bVar2 = ReadVarint64Slow(this,(uint64_t *)&local_58);
    uVar6 = CONCAT71(extraout_var,bVar2) & 0xffffffff;
  }
  else {
    if (-1 < (char)*pbVar1) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x1a1);
      other = internal::LogMessage::operator<<(&local_58,"CHECK failed: (buffer[0]) >= (128): ");
      internal::LogFinisher::operator=(&local_59,other);
      internal::LogMessage::~LogMessage(&local_58);
      in_RDX = extraout_RDX;
    }
    if ((long)(char)pbVar1[1] < 0) {
      if ((long)(char)pbVar1[2] < 0) {
        if ((long)(char)pbVar1[3] < 0) {
          if ((long)(char)pbVar1[4] < 0) {
            if ((long)(char)pbVar1[5] < 0) {
              if ((long)(char)pbVar1[6] < 0) {
                if ((long)(char)pbVar1[7] < 0) {
                  if ((long)(char)pbVar1[8] < 0) {
                    local_58._0_8_ = SEXT18((char)pbVar1[9]);
                    if ((long)local_58._0_8_ < 0) {
                      bVar2 = false;
                      uVar7 = 0;
                      lVar8 = 0xb;
                    }
                    else {
                      local_58._0_8_ = local_58._0_8_ << 0x3f;
                      lVar3 = 0;
                      lVar8 = 10;
                      pbVar4 = pbVar1;
                      do {
                        lVar5 = (ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f);
                        local_58._0_8_ = local_58._0_8_ + lVar5;
                        lVar3 = lVar3 + 7;
                        pbVar4 = pbVar4 + 1;
                        uVar7 = (undefined7)((ulong)lVar5 >> 8);
                        bVar2 = true;
                      } while (lVar3 != 0x3f);
                    }
                  }
                  else {
                    local_58._0_8_ = (long)(char)pbVar1[8] << 0x38;
                    lVar3 = 0;
                    lVar8 = 9;
                    pbVar4 = pbVar1;
                    do {
                      lVar5 = (ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f);
                      local_58._0_8_ = local_58._0_8_ + lVar5;
                      lVar3 = lVar3 + 7;
                      pbVar4 = pbVar4 + 1;
                      uVar7 = (undefined7)((ulong)lVar5 >> 8);
                      bVar2 = true;
                    } while (lVar3 != 0x38);
                  }
                }
                else {
                  local_58._0_8_ = (long)(char)pbVar1[7] << 0x31;
                  lVar3 = 0;
                  lVar8 = 8;
                  pbVar4 = pbVar1;
                  do {
                    lVar5 = (ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f);
                    local_58._0_8_ = local_58._0_8_ + lVar5;
                    lVar3 = lVar3 + 7;
                    pbVar4 = pbVar4 + 1;
                    uVar7 = (undefined7)((ulong)lVar5 >> 8);
                    bVar2 = true;
                  } while (lVar3 != 0x31);
                }
              }
              else {
                local_58._0_8_ = (long)(char)pbVar1[6] << 0x2a;
                lVar3 = 0;
                lVar8 = 7;
                pbVar4 = pbVar1;
                do {
                  lVar5 = (ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f);
                  local_58._0_8_ = local_58._0_8_ + lVar5;
                  lVar3 = lVar3 + 7;
                  pbVar4 = pbVar4 + 1;
                  uVar7 = (undefined7)((ulong)lVar5 >> 8);
                  bVar2 = true;
                } while (lVar3 != 0x2a);
              }
            }
            else {
              local_58._0_8_ = (long)(char)pbVar1[5] << 0x23;
              lVar3 = 0;
              lVar8 = 6;
              pbVar4 = pbVar1;
              do {
                lVar5 = (ulong)*pbVar4 - 0x80 << ((byte)lVar3 & 0x3f);
                local_58._0_8_ = local_58._0_8_ + lVar5;
                lVar3 = lVar3 + 7;
                pbVar4 = pbVar4 + 1;
                uVar7 = (undefined7)((ulong)lVar5 >> 8);
                bVar2 = true;
              } while (lVar3 != 0x23);
            }
          }
          else {
            local_58._0_8_ = (long)(char)pbVar1[4] << 0x1c;
            lVar8 = 0;
            pbVar4 = pbVar1;
            do {
              local_58._0_8_ = local_58._0_8_ + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
              lVar8 = lVar8 + 7;
              pbVar4 = pbVar4 + 1;
            } while (lVar8 != 0x1c);
            uVar7 = (undefined7)((ulong)pbVar4 >> 8);
            bVar2 = true;
            lVar8 = 5;
          }
        }
        else {
          local_58._0_8_ = (long)(char)pbVar1[3] << 0x15;
          lVar8 = 0;
          pbVar4 = pbVar1;
          do {
            local_58._0_8_ = local_58._0_8_ + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
            lVar8 = lVar8 + 7;
            pbVar4 = pbVar4 + 1;
          } while (lVar8 != 0x15);
          uVar7 = (undefined7)((ulong)pbVar4 >> 8);
          bVar2 = true;
          lVar8 = 4;
        }
      }
      else {
        local_58._0_8_ = (long)(char)pbVar1[2] << 0xe;
        lVar8 = 0;
        pbVar4 = pbVar1;
        do {
          local_58._0_8_ = local_58._0_8_ + ((ulong)*pbVar4 - 0x80 << ((byte)lVar8 & 0x3f));
          lVar8 = lVar8 + 7;
          pbVar4 = pbVar4 + 1;
        } while (lVar8 == 7);
        uVar7 = (undefined7)((ulong)pbVar4 >> 8);
        bVar2 = true;
        lVar8 = 3;
      }
    }
    else {
      local_58._0_8_ = ((long)(char)pbVar1[1] * 0x80 + (ulong)*pbVar1) - 0x80;
      uVar7 = (undefined7)((ulong)in_RDX >> 8);
      bVar2 = true;
      lVar8 = 2;
    }
    if (bVar2) {
      this->buffer_ = pbVar1 + lVar8;
      uVar6 = CONCAT71(uVar7,1);
    }
    else {
      local_58._0_8_ = 0;
      uVar6 = 0;
    }
  }
  pVar9._8_8_ = uVar6;
  pVar9.first = local_58._0_8_;
  return pVar9;
}

Assistant:

std::pair<uint64_t, bool> CodedInputStream::ReadVarint64Fallback() {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    uint64_t temp;
    ::std::pair<bool, const uint8_t*> p = ReadVarint64FromArray(buffer_, &temp);
    if (!p.first) {
      return std::make_pair(0, false);
    }
    buffer_ = p.second;
    return std::make_pair(temp, true);
  } else {
    uint64_t temp;
    bool success = ReadVarint64Slow(&temp);
    return std::make_pair(temp, success);
  }
}